

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.cpp
# Opt level: O3

int __thiscall llvm::StringMapImpl::FindKey(StringMapImpl *this,StringRef Key)

{
  uint uVar1;
  uint uVar2;
  StringMapEntryBase **ppSVar3;
  StringMapEntryBase *pSVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  size_t __n;
  uint uVar8;
  uint uVar9;
  int iVar10;
  
  __n = Key.Length;
  uVar1 = this->NumBuckets;
  uVar6 = 0xffffffff;
  if ((ulong)uVar1 != 0) {
    if (__n == 0) {
      uVar9 = 0;
    }
    else {
      sVar7 = 0;
      uVar9 = 0;
      do {
        uVar9 = uVar9 * 0x21 + (uint)(byte)Key.Data[sVar7];
        sVar7 = sVar7 + 1;
      } while (__n != sVar7);
    }
    ppSVar3 = this->TheTable;
    uVar2 = this->ItemSize;
    iVar10 = 1;
    uVar8 = uVar9;
    while( true ) {
      uVar8 = uVar8 & uVar1 - 1;
      pSVar4 = ppSVar3[uVar8];
      uVar6 = 0xffffffff;
      if ((pSVar4 == (StringMapEntryBase *)0x0) ||
         ((((pSVar4 != (StringMapEntryBase *)0xfffffffffffffff8 &&
            (*(uint *)((long)ppSVar3 + (ulong)uVar8 * 4 + (ulong)uVar1 * 8 + 8) == uVar9)) &&
           (pSVar4->StrLen == __n)) &&
          ((uVar6 = uVar8, __n == 0 ||
           (iVar5 = bcmp(Key.Data,(void *)((long)&pSVar4->StrLen + (ulong)uVar2),__n), iVar5 == 0)))
          ))) break;
      uVar8 = uVar8 + iVar10;
      iVar10 = iVar10 + 1;
    }
  }
  return uVar6;
}

Assistant:

int StringMapImpl::FindKey(StringRef Key) const {
  unsigned HTSize = NumBuckets;
  if (HTSize == 0) return -1;  // Really empty table?
  unsigned FullHashValue = djbHash(Key, 0);
  unsigned BucketNo = FullHashValue & (HTSize-1);
  unsigned *HashTable = (unsigned *)(TheTable + NumBuckets + 1);

  unsigned ProbeAmt = 1;
  while (true) {
    StringMapEntryBase *BucketItem = TheTable[BucketNo];
    // If we found an empty bucket, this key isn't in the table yet, return.
    if (LLVM_LIKELY(!BucketItem))
      return -1;

    if (BucketItem == getTombstoneVal()) {
      // Ignore tombstones.
    } else if (LLVM_LIKELY(HashTable[BucketNo] == FullHashValue)) {
      // If the full hash value matches, check deeply for a match.  The common
      // case here is that we are only looking at the buckets (for item info
      // being non-null and for the full hash value) not at the items.  This
      // is important for cache locality.

      // Do the comparison like this because NameStart isn't necessarily
      // null-terminated!
      char *ItemStr = (char*)BucketItem+ItemSize;
      if (Key == StringRef(ItemStr, BucketItem->getKeyLength())) {
        // We found a match!
        return BucketNo;
      }
    }

    // Okay, we didn't find the item.  Probe to the next bucket.
    BucketNo = (BucketNo+ProbeAmt) & (HTSize-1);

    // Use quadratic probing, it has fewer clumping artifacts than linear
    // probing and has good cache behavior in the common case.
    ++ProbeAmt;
  }
}